

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O3

uint compute_register_from_base(Function *fn,Pseudo *pseudo)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *(uint *)pseudo;
  uVar2 = uVar1 & 0xf;
  if (1 < uVar2 - 0xb) {
    if (uVar2 == 0) {
      if (((pseudo->field_3).symbol)->symbol_type == SYM_LOCAL) {
        return uVar1 >> 4 & 0xffff;
      }
    }
    else if (uVar2 == 4) goto LAB_001221ab;
    handle_error_bad_pseudo(fn,pseudo,"compute_register_from_base: Unexpected pseudo type");
  }
LAB_001221ab:
  return (uVar1 >> 4 & 0xffff) + (fn->proc->local_pseudos).max_reg;
}

Assistant:

static unsigned compute_register_from_base(Function *fn, const Pseudo *pseudo)
{
	switch (pseudo->type) {
	case PSEUDO_TEMP_ANY:
	case PSEUDO_RANGE: // Compute starting register
	case PSEUDO_RANGE_SELECT:
		// we put all temps on Lua stack after the locals
		return pseudo->regnum + num_locals(fn->proc);
	case PSEUDO_SYMBOL:
		if (pseudo->symbol->symbol_type == SYM_LOCAL) {
			return pseudo->regnum;
		}
		// fallthrough
	default:
		handle_error_bad_pseudo(fn, pseudo, "compute_register_from_base: Unexpected pseudo type");
		return (unsigned)-1;
	}
}